

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

void m_initgrp(monst *mtmp,level *lev,int x,int y,int n)

{
  byte bVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RAX;
  monst *mtmp_00;
  sbyte sVar5;
  uint uVar6;
  coord mm;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar1 = level_difficulty(&lev->z);
  uVar3 = mt_random();
  uVar6 = SUB164(ZEXT416(uVar3) % SEXT816((long)n),0) + 1;
  uVar3 = uVar6;
  if ('\0' < (char)bVar1) {
    uVar4 = 4;
    if (2 < bVar1) {
      uVar4 = (bVar1 < 5) + 1;
    }
    uVar3 = 1;
    if (uVar4 <= uVar6) {
      sVar5 = 2;
      if (2 < bVar1) {
        sVar5 = bVar1 < 5;
      }
      uVar3 = uVar6 >> sVar5;
      if (uVar6 >> sVar5 == 0) {
        return;
      }
    }
  }
  uStack_38 = CONCAT17((char)y,CONCAT16((char)x,(undefined6)uStack_38));
  do {
    bVar2 = peace_minded(mtmp->data);
    if (bVar2 == '\0') {
      bVar2 = enexto((coord *)((long)&uStack_38 + 6),lev,uStack_38._6_1_,uStack_38._7_1_,mtmp->data)
      ;
      if (bVar2 != '\0') {
        mtmp_00 = makemon(mtmp->data,lev,(int)uStack_38._6_1_,(int)uStack_38._7_1_,0);
        if (mtmp_00 != (monst *)0x0) {
          *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffbf7fff;
          set_malign(mtmp_00);
        }
      }
    }
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  return;
}

Assistant:

static void m_initgrp(struct monst *mtmp, struct level *lev, int x, int y, int n)
{
	coord mm;
	int dl = level_difficulty(&lev->z);
	int cnt = rnd(n);
	struct monst *mon;

	/* Tuning: cut down on swarming at shallow depths */
	if (dl > 0) {
	    cnt /= (dl < 3) ? 4 : (dl < 5) ? 2 : 1;
	    if (!cnt) cnt++;
	}

	mm.x = x;
	mm.y = y;
	while (cnt--) {
		if (peace_minded(mtmp->data)) continue;
		/* Don't create groups of peaceful monsters since they'll get
		 * in our way.  If the monster has a percentage chance so some
		 * are peaceful and some are not, the result will just be a
		 * smaller group.
		 */
		if (enexto(&mm, lev, mm.x, mm.y, mtmp->data)) {
		    mon = makemon(mtmp->data, lev, mm.x, mm.y, NO_MM_FLAGS);
		    if (mon) {
			mon->mpeaceful = FALSE;
			mon->mavenge = 0;
			set_malign(mon);
			/* Undo the second peace_minded() check in makemon();
			 * if the monster turned out to be peaceful the first
			 * time we didn't create it at all; we don't want a
			 * second check.
			 */
		    }
		}
	}
}